

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O0

Matrix_Sparse * __thiscall
Disa::Matrix_Sparse::matrix_arithmetic<true>(Matrix_Sparse *this,Matrix_Sparse *other)

{
  double dVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  source_location *psVar5;
  source_location *location;
  ostream *poVar6;
  size_t sVar7;
  pointer pvVar8;
  size_t *psVar9;
  size_t *i_column;
  Scalar *pSVar10;
  reference pvVar11;
  undefined1 local_2e8 [64];
  iterator local_2a8;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_288;
  iterator local_278;
  Matrix_Sparse_Row<const_Disa::Matrix_Sparse> local_258;
  undefined1 local_248 [8];
  const_iterator_element iter_element_other;
  iterator iter_element_this;
  undefined1 local_1f8 [8];
  const_iterator iter_other;
  iterator iter_this;
  undefined1 local_1d0 [7];
  bool insert_state;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Matrix_Sparse *local_18;
  Matrix_Sparse *other_local;
  Matrix_Sparse *this_local;
  
  local_18 = other;
  other_local = this;
  psVar5 = (source_location *)size_row(this);
  location = (source_location *)size_row(local_18);
  if (psVar5 == location) {
    psVar5 = (source_location *)size_column(this);
    location = (source_location *)size_column(local_18);
    if (psVar5 == location) {
      begin((Matrix_Sparse *)&iter_other.matrix_row.row_index);
      _local_1f8 = (value_type)begin(local_18);
      while( true ) {
        join_0x00000010_0x00000000_ = (value_type)end(local_18);
        bVar3 = Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator!=
                          ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_1f8,
                           (Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)
                           &iter_element_this.matrix);
        if (!bVar3) break;
        pvVar8 = Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::
                 operator-><Disa::Matrix_Sparse,_true>
                           ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)
                            &iter_other.matrix_row.row_index);
        Matrix_Sparse_Row<Disa::Matrix_Sparse>::begin((iterator *)&iter_element_other.matrix,pvVar8)
        ;
        local_258 = Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator*
                              ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_1f8);
        Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::begin((iterator *)local_248,&local_258);
        while( true ) {
          local_288 = Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator*
                                ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_1f8)
          ;
          Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::end(&local_278,&local_288);
          bVar3 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator!=
                            ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_248,
                             &local_278);
          if (!bVar3) break;
          pvVar8 = Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::
                   operator-><Disa::Matrix_Sparse,_true>
                             ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)
                              &iter_other.matrix_row.row_index);
          Matrix_Sparse_Row<Disa::Matrix_Sparse>::end(&local_2a8,pvVar8);
          bVar4 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator==
                            ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)
                             &iter_element_other.matrix,&local_2a8);
          bVar3 = true;
          if (!bVar4) {
            psVar9 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column
                               ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)
                                &iter_element_other.matrix);
            uVar2 = *psVar9;
            psVar9 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column
                               ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)
                                local_248);
            bVar3 = *psVar9 < uVar2;
          }
          if (bVar3) {
            psVar9 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_row
                               ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)
                                local_248);
            i_column = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column
                                 ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)
                                  local_248);
            pSVar10 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator*
                                ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)
                                 local_248);
            local_2e8._16_8_ = *pSVar10;
            insert((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)
                   (local_2e8 + 0x18),this,psVar9,i_column,(double *)(local_2e8 + 0x10));
            std::tie<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,bool>
                      ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_2e8,
                       (bool *)&iter_element_other.matrix);
            std::tuple<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>&,bool&>::operator=
                      ((tuple<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>&,bool&> *)
                       local_2e8,
                       (pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)
                       (local_2e8 + 0x18));
            Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator++
                      ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)
                       &iter_element_other.matrix);
            Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator++
                      ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_248);
          }
          else {
            psVar9 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::i_column
                               ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)
                                &iter_element_other.matrix);
            uVar2 = *psVar9;
            psVar9 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::i_column
                               ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)
                                local_248);
            if (uVar2 < *psVar9) {
              Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator++
                        ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)
                         &iter_element_other.matrix);
            }
            else {
              pSVar10 = Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator*
                                  ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)
                                   local_248);
              dVar1 = *pSVar10;
              pvVar11 = Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::
                        operator*<Disa::Matrix_Sparse,_true>
                                  ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)
                                   &iter_element_other.matrix);
              *pvVar11 = dVar1 + *pvVar11;
              Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::operator++
                        ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)
                         &iter_element_other.matrix);
              Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::operator++
                        ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_248);
            }
          }
        }
        Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator++
                  ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)
                   &iter_other.matrix_row.row_index);
        Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse>::operator++
                  ((Iterator_Matrix_Sparse_Row<const_Disa::Matrix_Sparse> *)local_1f8);
      }
      return this;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"\n");
  local_40 = &PTR_s__workspace_llm4binary_github_lic_001b7bb0;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
  poVar6 = std::operator<<(poVar6,(string *)&local_38);
  sVar7 = size_row(this);
  std::__cxx11::to_string(&local_170,sVar7);
  std::operator+(&local_150,"Incompatible other dimensions, ",&local_170);
  std::operator+(&local_130,&local_150,",");
  sVar7 = size_column(this);
  std::__cxx11::to_string(&local_190,sVar7);
  std::operator+(&local_110,&local_130,&local_190);
  std::operator+(&local_f0,&local_110," vs. ");
  sVar7 = size_row(local_18);
  std::__cxx11::to_string(&local_1b0,sVar7);
  std::operator+(&local_d0,&local_f0,&local_1b0);
  std::operator+(&local_b0,&local_d0,",");
  sVar7 = size_column(local_18);
  std::__cxx11::to_string((string *)local_1d0,sVar7);
  std::operator+(&local_90,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
  std::operator+(&local_70,&local_90,".");
  poVar6 = std::operator<<(poVar6,(string *)&local_70);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

Matrix_Sparse& Matrix_Sparse::matrix_arithmetic(const Matrix_Sparse& other) {
  ASSERT_DEBUG(size_row() == other.size_row() && size_column() == other.size_column(),
               "Incompatible other dimensions, " + std::to_string(size_row()) + "," + std::to_string(size_column()) +
               " vs. " + std::to_string(other.size_row()) + "," + std::to_string(other.size_column()) + ".");

  bool insert_state;
  iterator iter_this = begin();
  const_iterator iter_other = other.begin();
  while(iter_other != other.end()) {
    auto iter_element_this = iter_this->begin();
    const_iterator_element iter_element_other = (*iter_other).begin();
    while(iter_element_other != (*iter_other).end()) {
      if(iter_element_this == iter_this->end() || iter_element_this.i_column() > iter_element_other.i_column()) {
        std::tie(iter_element_this, insert_state) = insert(iter_element_other.i_row(), iter_element_other.i_column(),
                                                           _is_add ? (*iter_element_other) : -(*iter_element_other));
        ++iter_element_this;
        ++iter_element_other;
      } else if(iter_element_this.i_column() < iter_element_other.i_column()) {
        ++iter_element_this;
      } else {
        *iter_element_this += _is_add ? (*iter_element_other) : -(*iter_element_other);
        ++iter_element_this;
        ++iter_element_other;
      }
    }
    ++iter_this;
    ++iter_other;
  }
  return *this;
}